

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateExecutionScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  spv_const_context psVar4;
  Function *pFVar5;
  DiagnosticStream *pDVar6;
  char *local_6f8;
  DiagnosticStream local_6f0;
  char *local_518;
  string local_510;
  DiagnosticStream local_4f0;
  anon_class_32_1_293d74c2 local_318;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_2f8;
  undefined1 local_2d8 [8];
  string errorVUID_1;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_298;
  undefined1 local_278 [8];
  string errorVUID;
  string local_250;
  DiagnosticStream local_230;
  uint local_58;
  spv_result_t local_54;
  Scope value;
  spv_result_t error;
  tuple<bool,_bool,_unsigned_int> local_38;
  uint local_30;
  bool local_2a;
  bool local_29;
  uint32_t tmp_value;
  bool is_const_int32;
  uint32_t uStack_24;
  bool is_int32;
  Op opcode;
  uint32_t scope_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uStack_24 = scope;
  _opcode = inst;
  inst_local = (Instruction *)_;
  tmp_value = Instruction::opcode(inst);
  local_29 = false;
  local_2a = false;
  local_30 = 0;
  ValidationState_t::EvalInt32IfConst(&local_38,(ValidationState_t *)inst_local,uStack_24);
  std::tie<bool,bool,unsigned_int>
            ((tuple<bool_&,_bool_&,_unsigned_int_&> *)&value,&local_29,&local_2a,&local_30);
  std::tuple<bool&,bool&,unsigned_int&>::operator=
            ((tuple<bool&,bool&,unsigned_int&> *)&value,&local_38);
  local_54 = ValidateScope((ValidationState_t *)inst_local,_opcode,uStack_24);
  __local._4_4_ = local_54;
  if (local_54 == SPV_SUCCESS) {
    if ((local_2a & 1U) == 0) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      local_58 = local_30;
      psVar4 = ValidationState_t::context((ValidationState_t *)inst_local);
      bVar2 = spvIsVulkanEnv(psVar4->target_env);
      if (bVar2) {
        psVar4 = ValidationState_t::context((ValidationState_t *)inst_local);
        if ((((psVar4->target_env != SPV_ENV_VULKAN_1_0) &&
             (bVar2 = spvOpcodeIsNonUniformGroupOperation(tmp_value), bVar2)) &&
            (tmp_value != 0x13f6)) && ((tmp_value != 0x13f7 && (local_58 != 3)))) {
          ValidationState_t::diag
                    (&local_230,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
          ValidationState_t::VkErrorID_abi_cxx11_
                    (&local_250,(ValidationState_t *)inst_local,0x1222,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_230,&local_250);
          errorVUID.field_2._8_8_ = spvOpcodeString(tmp_value);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char **)((long)&errorVUID.field_2 + 8));
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [55])
                                     ": in Vulkan environment Execution scope is limited to ");
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [9])0x634fc7);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_250);
          DiagnosticStream::~DiagnosticStream(&local_230);
          return __local._4_4_;
        }
        if ((tmp_value == 0xe0) && (local_58 != 3)) {
          ValidationState_t::VkErrorID_abi_cxx11_
                    ((string *)local_278,(ValidationState_t *)inst_local,0x124a,(char *)0x0);
          pIVar1 = inst_local;
          pFVar5 = Instruction::function(_opcode);
          uVar3 = Function::id(pFVar5);
          pFVar5 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
          std::__cxx11::string::string
                    ((string *)(errorVUID_1.field_2._M_local_buf + 8),(string *)local_278);
          std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
          function<spvtools::val::ValidateExecutionScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)::__0,void>
                    ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_298,
                     (anon_class_32_1_293d74c2 *)((long)&errorVUID_1.field_2 + 8));
          Function::RegisterExecutionModelLimitation(pFVar5,&local_298);
          std::
          function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
          ::~function(&local_298);
          ValidateExecutionScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)
          ::$_0::~__0((__0 *)(errorVUID_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_278);
        }
        if (local_58 == 2) {
          ValidationState_t::VkErrorID_abi_cxx11_
                    ((string *)local_2d8,(ValidationState_t *)inst_local,0x121d,(char *)0x0);
          pIVar1 = inst_local;
          pFVar5 = Instruction::function(_opcode);
          uVar3 = Function::id(pFVar5);
          pFVar5 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
          std::__cxx11::string::string((string *)&local_318,(string *)local_2d8);
          std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
          function<spvtools::val::ValidateExecutionScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)::__1,void>
                    ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_2f8,
                     &local_318);
          Function::RegisterExecutionModelLimitation(pFVar5,&local_2f8);
          std::
          function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
          ::~function(&local_2f8);
          ValidateExecutionScope(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,unsigned_int)
          ::$_1::~__1((__1 *)&local_318);
          std::__cxx11::string::~string((string *)local_2d8);
        }
        if ((local_58 != 2) && (local_58 != 3)) {
          ValidationState_t::diag
                    (&local_4f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
          ValidationState_t::VkErrorID_abi_cxx11_
                    (&local_510,(ValidationState_t *)inst_local,0x121c,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_4f0,&local_510);
          local_518 = spvOpcodeString(tmp_value);
          pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_518);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [55])
                                     ": in Vulkan environment Execution Scope is limited to ");
          pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [23])"Workgroup and Subgroup");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_510);
          DiagnosticStream::~DiagnosticStream(&local_4f0);
          return __local._4_4_;
        }
      }
      bVar2 = spvOpcodeIsNonUniformGroupOperation(tmp_value);
      if ((((bVar2) && (tmp_value != 0x13f6)) && (tmp_value != 0x13f7)) &&
         ((local_58 != 3 && (local_58 != 2)))) {
        ValidationState_t::diag
                  (&local_6f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_opcode);
        local_6f8 = spvOpcodeString(tmp_value);
        pDVar6 = DiagnosticStream::operator<<(&local_6f0,&local_6f8);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [54])
                                   ": Execution scope is limited to Subgroup or Workgroup");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        DiagnosticStream::~DiagnosticStream(&local_6f0);
      }
      else {
        __local._4_4_ = SPV_SUCCESS;
      }
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateExecutionScope(ValidationState_t& _,
                                    const Instruction* inst, uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  // Vulkan specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    // Vulkan 1.1 specific rules
    if (_.context()->target_env != SPV_ENV_VULKAN_1_0) {
      // Scope for Non Uniform Group Operations must be limited to Subgroup
      if ((spvOpcodeIsNonUniformGroupOperation(opcode) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) &&
          (value != spv::Scope::Subgroup)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4642) << spvOpcodeString(opcode)
               << ": in Vulkan environment Execution scope is limited to "
               << "Subgroup";
      }
    }

    // OpControlBarrier must only use Subgroup execution scope for a subset of
    // execution models.
    if (opcode == spv::Op::OpControlBarrier && value != spv::Scope::Subgroup) {
      std::string errorVUID = _.VkErrorID(4682);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::Fragment ||
                model == spv::ExecutionModel::Vertex ||
                model == spv::ExecutionModel::Geometry ||
                model == spv::ExecutionModel::TessellationEvaluation ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, OpControlBarrier execution scope "
                    "must be Subgroup for Fragment, Vertex, Geometry, "
                    "TessellationEvaluation, RayGeneration, Intersection, "
                    "AnyHit, ClosestHit, and Miss execution models";
              }
              return false;
            }
            return true;
          });
    }

    // Only subset of execution models support Workgroup.
    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(4637);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::GLCompute) {
                  if (message) {
                    *message =
                        errorVUID +
                        "in Vulkan environment, Workgroup execution scope is "
                        "only for TaskNV, MeshNV, TaskEXT, MeshEXT, "
                        "TessellationControl, and GLCompute execution models";
                  }
                  return false;
                }
                return true;
              });
    }

    // Vulkan generic rules
    // Scope for execution must be limited to Workgroup or Subgroup
    if (value != spv::Scope::Workgroup && value != spv::Scope::Subgroup) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4636) << spvOpcodeString(opcode)
             << ": in Vulkan environment Execution Scope is limited to "
             << "Workgroup and Subgroup";
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  // General SPIRV rules
  // Scope for execution must be limited to Workgroup or Subgroup for
  // non-uniform operations
  if (spvOpcodeIsNonUniformGroupOperation(opcode) &&
      opcode != spv::Op::OpGroupNonUniformQuadAllKHR &&
      opcode != spv::Op::OpGroupNonUniformQuadAnyKHR &&
      value != spv::Scope::Subgroup && value != spv::Scope::Workgroup) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Execution scope is limited to Subgroup or Workgroup";
  }

  return SPV_SUCCESS;
}